

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O0

void __thiscall JsonNumber_NegativePi_Test::TestBody(JsonNumber_NegativePi_Test *this)

{
  bool bVar1;
  MockSpec<std::error_code_(double)> *this_00;
  TypedExpectation<std::error_code_(double)> *this_01;
  parser<callbacks_proxy<mock_json_callbacks>_> *this_02;
  char *message;
  char *in_R9;
  string local_180;
  AssertHelper local_160;
  Message local_158;
  bool local_149;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_;
  undefined1 local_110 [8];
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  FloatingEqMatcher<double> local_60;
  Matcher<double> local_48;
  MockSpec<std::error_code_(double)> local_30;
  JsonNumber_NegativePi_Test *local_10;
  JsonNumber_NegativePi_Test *this_local;
  
  local_10 = this;
  testing::DoubleEq(&local_60,-3.1415);
  testing::internal::FloatingEqMatcher::operator_cast_to_Matcher
            (&local_48,(FloatingEqMatcher *)&local_60);
  mock_json_callbacks::gmock_double_value
            (&local_30,&(this->super_JsonNumber).callbacks_.super_mock_json_callbacks,&local_48);
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<std::error_code_(double)>::operator()
                      (&local_30,(WithoutMatchers *)((long)&p.coordinate_.column + 3),(void *)0x0);
  this_01 = testing::internal::MockSpec<std::error_code_(double)>::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_number.cpp"
                       ,0x6c,"callbacks_","double_value (DoubleEq (-3.1415))");
  testing::internal::TypedExpectation<std::error_code_(double)>::Times(this_01,1);
  testing::internal::MockSpec<std::error_code_(double)>::~MockSpec(&local_30);
  testing::Matcher<double>::~Matcher(&local_48);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::parser
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_110,
             (this->super_JsonNumber).proxy_.original_,none);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &gtest_ar_.message_,"-3.1415",7);
  this_02 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::input
                      ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_110,
                       (string *)&gtest_ar_.message_);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(this_02);
  std::__cxx11::string::~string((string *)&gtest_ar_.message_);
  local_149 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::has_error
                        ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_110);
  local_149 = !local_149;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_148,&local_149,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_180,(internal *)local_148,(AssertionResult *)"p.has_error ()","true","false",
               in_R9);
    message = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_number.cpp"
               ,0x6f,message);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    testing::Message::~Message(&local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::~parser
            ((parser<callbacks_proxy<mock_json_callbacks>_> *)local_110);
  return;
}

Assistant:

TEST_F (JsonNumber, NegativePi) {
    EXPECT_CALL (callbacks_, double_value (DoubleEq (-3.1415))).Times (1);
    json::parser<decltype (proxy_)> p (proxy_);
    p.input ("-3.1415"s).eof ();
    EXPECT_FALSE (p.has_error ());
}